

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall
phyr::FilmTile::FilmTile
          (FilmTile *this,Bounds2i *pixelBounds,Vector2f *filterRadius,double *filterTable,
          int filterTableSize)

{
  undefined8 uVar1;
  double dVar2;
  int iVar3;
  vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> *__x;
  undefined8 in_RCX;
  double *in_RDX;
  undefined8 *in_RSI;
  allocator_type *in_RDI;
  allocator_type *__n;
  undefined4 in_R8D;
  Bounds2<int> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa0;
  int local_48 [9];
  undefined4 local_24;
  undefined8 local_20;
  
  uVar1 = in_RSI[1];
  *(undefined8 *)in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + 8) = uVar1;
  dVar2 = in_RDX[1];
  *(double *)(in_RDI + 0x10) = *in_RDX;
  *(double *)(in_RDI + 0x18) = dVar2;
  local_24 = in_R8D;
  local_20 = in_RCX;
  Vector2<double>::Vector2((Vector2<double> *)(in_RDI + 0x20),1.0 / *in_RDX,1.0 / in_RDX[1]);
  *(undefined8 *)(in_RDI + 0x30) = local_20;
  *(undefined4 *)(in_RDI + 0x38) = local_24;
  __n = in_RDI + 0x40;
  std::vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::vector
            ((vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> *)0x1847e4);
  local_48[1] = 0;
  iVar3 = Bounds2<int>::area(in_stack_ffffffffffffff80);
  local_48[0] = iVar3;
  __x = (vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> *)
        std::max<int>(local_48 + 1,local_48);
  std::allocator<phyr::FilmTilePixel>::allocator((allocator<phyr::FilmTilePixel> *)0x184835);
  std::vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::vector
            ((vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> *)
             CONCAT44(iVar3,in_stack_ffffffffffffffa0),(size_type)__n,in_RDI);
  std::vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::operator=
            ((vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> *)in_RDI,__x);
  std::vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::~vector
            ((vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> *)in_RDI);
  std::allocator<phyr::FilmTilePixel>::~allocator((allocator<phyr::FilmTilePixel> *)0x184871);
  return;
}

Assistant:

FilmTile(const Bounds2i& pixelBounds, const Vector2f& filterRadius,
             const Real* filterTable, int filterTableSize) :
        pixelBounds(pixelBounds), filterRadius(filterRadius),
        invFilterRadius(Real(1) / filterRadius.x, Real(1) / filterRadius.y),
        filterTable(filterTable), filterTableSize(filterTableSize) {
        // Allocate pixels
        pixels = std::vector<FilmTilePixel>(std::max(0, pixelBounds.area()));
    }